

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

void __thiscall CVmMetaTable::rebuild_image(CVmMetaTable *this,CVmImageWriter *writer)

{
  CVmImageWriter *pCVar1;
  vm_meta_entry_t *this_00;
  char *in_RSI;
  CVmMetaTable *in_RDI;
  ushort j;
  vm_meta_entry_t *entry;
  size_t i;
  char *in_stack_ffffffffffffffb8;
  CVmImageWriter *in_stack_ffffffffffffffc0;
  CVmImageWriter *this_01;
  ushort local_22;
  CVmImageWriter *local_18;
  
  get_count(in_RDI);
  CVmImageWriter::begin_meta_dep
            (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  local_18 = (CVmImageWriter *)0x0;
  while( true ) {
    this_01 = local_18;
    pCVar1 = (CVmImageWriter *)get_count(in_RDI);
    if (pCVar1 <= this_01) break;
    this_00 = get_entry(in_RDI,(int)local_18);
    CVmImageWriter::write_meta_dep_item(this_01,in_stack_ffffffffffffffb8);
    for (local_22 = 1; (ulong)local_22 <= this_00->func_xlat_cnt_; local_22 = local_22 + 1) {
      in_stack_ffffffffffffffb8 = in_RSI;
      vm_meta_entry_t::xlat_func(this_00,local_22);
      CVmImageWriter::write_meta_item_prop(this_01,(uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
      ;
    }
    local_18 = (CVmImageWriter *)((long)&local_18->fp_ + 1);
  }
  CVmImageWriter::end_meta_dep(this_01);
  return;
}

Assistant:

void CVmMetaTable::rebuild_image(CVmImageWriter *writer)
{
    size_t i;
    
    /* begin the new metaclass dependency table */
    writer->begin_meta_dep(get_count());

    /* write the new metaclass dependency table items */
    for (i = 0 ; i < get_count() ; ++i)
    {
        vm_meta_entry_t *entry;
        ushort j;

        /* get this entry */
        entry = get_entry(i);
        
        /* write this metaclass name */
        writer->write_meta_dep_item(entry->image_meta_name_);

        /* 
         *   Write the property translation list.  Note that xlat_func()
         *   requires a 1-based index, so we loop from 1 to the count,
         *   rather than following the usual C-style 0-based conventions.  
         */
        for (j = 1 ; j <= entry->func_xlat_cnt_ ; ++j)
            writer->write_meta_item_prop(entry->xlat_func(j));
    }
    
    /* end the metaclass dependency table */
    writer->end_meta_dep();
}